

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O2

void comp_mask_pred_line_avx2(__m256i s0,__m256i s1,__m256i a,uint8_t *comp_pred)

{
  undefined1 auVar1 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar2 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar3 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar4 [32];
  
  auVar4[8] = 0x40;
  auVar4._0_8_ = 0x4040404040404040;
  auVar4[9] = 0x40;
  auVar4[10] = 0x40;
  auVar4[0xb] = 0x40;
  auVar4[0xc] = 0x40;
  auVar4[0xd] = 0x40;
  auVar4[0xe] = 0x40;
  auVar4[0xf] = 0x40;
  auVar4[0x10] = 0x40;
  auVar4[0x11] = 0x40;
  auVar4[0x12] = 0x40;
  auVar4[0x13] = 0x40;
  auVar4[0x14] = 0x40;
  auVar4[0x15] = 0x40;
  auVar4[0x16] = 0x40;
  auVar4[0x17] = 0x40;
  auVar4[0x18] = 0x40;
  auVar4[0x19] = 0x40;
  auVar4[0x1a] = 0x40;
  auVar4[0x1b] = 0x40;
  auVar4[0x1c] = 0x40;
  auVar4[0x1d] = 0x40;
  auVar4[0x1e] = 0x40;
  auVar4[0x1f] = 0x40;
  auVar3 = in_ZMM2._0_32_;
  auVar1 = vpsubb_avx2(auVar4,auVar3);
  auVar4 = vpunpcklbw_avx2(in_ZMM0._0_32_,in_ZMM1._0_32_);
  auVar2 = vpunpcklbw_avx2(auVar3,auVar1);
  auVar4 = vpmaddubsw_avx2(auVar4,auVar2);
  auVar2 = vpunpckhbw_avx2(in_ZMM0._0_32_,in_ZMM1._0_32_);
  auVar1 = vpunpckhbw_avx2(auVar3,auVar1);
  auVar1 = vpmaddubsw_avx2(auVar2,auVar1);
  auVar2._8_2_ = 0x200;
  auVar2._0_8_ = 0x200020002000200;
  auVar2._10_2_ = 0x200;
  auVar2._12_2_ = 0x200;
  auVar2._14_2_ = 0x200;
  auVar2._16_2_ = 0x200;
  auVar2._18_2_ = 0x200;
  auVar2._20_2_ = 0x200;
  auVar2._22_2_ = 0x200;
  auVar2._24_2_ = 0x200;
  auVar2._26_2_ = 0x200;
  auVar2._28_2_ = 0x200;
  auVar2._30_2_ = 0x200;
  auVar4 = vpmulhrsw_avx2(auVar4,auVar2);
  auVar1 = vpmulhrsw_avx2(auVar1,auVar2);
  auVar4 = vpackuswb_avx2(auVar4,auVar1);
  *(undefined1 (*) [32])comp_pred = auVar4;
  return;
}

Assistant:

static inline void comp_mask_pred_line_avx2(const __m256i s0, const __m256i s1,
                                            const __m256i a,
                                            uint8_t *comp_pred) {
  const __m256i alpha_max = _mm256_set1_epi8(AOM_BLEND_A64_MAX_ALPHA);
  const int16_t round_bits = 15 - AOM_BLEND_A64_ROUND_BITS;
  const __m256i round_offset = _mm256_set1_epi16(1 << (round_bits));

  const __m256i ma = _mm256_sub_epi8(alpha_max, a);

  const __m256i ssAL = _mm256_unpacklo_epi8(s0, s1);
  const __m256i aaAL = _mm256_unpacklo_epi8(a, ma);
  const __m256i ssAH = _mm256_unpackhi_epi8(s0, s1);
  const __m256i aaAH = _mm256_unpackhi_epi8(a, ma);

  const __m256i blendAL = _mm256_maddubs_epi16(ssAL, aaAL);
  const __m256i blendAH = _mm256_maddubs_epi16(ssAH, aaAH);
  const __m256i roundAL = _mm256_mulhrs_epi16(blendAL, round_offset);
  const __m256i roundAH = _mm256_mulhrs_epi16(blendAH, round_offset);

  const __m256i roundA = _mm256_packus_epi16(roundAL, roundAH);
  _mm256_storeu_si256((__m256i *)(comp_pred), roundA);
}